

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StreamExpressionWithRangeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamExpressionWithRangeSyntax,slang::parsing::Token,slang::syntax::ElementSelectSyntax&>
          (BumpAllocator *this,Token *args,ElementSelectSyntax *args_1)

{
  Token withKeyword;
  StreamExpressionWithRangeSyntax *pSVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pSVar1 = (StreamExpressionWithRangeSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  withKeyword.info = in_RSI;
  withKeyword._0_8_ = in_RDX;
  slang::syntax::StreamExpressionWithRangeSyntax::StreamExpressionWithRangeSyntax
            ((StreamExpressionWithRangeSyntax *)in_RSI->location,withKeyword,
             (ElementSelectSyntax *)in_RSI->rawTextPtr);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }